

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O0

PlatformSpecificMutex PThreadMutexCreate(void)

{
  char *in_RAX;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *mutex;
  
  __mutex = (pthread_mutex_t *)operator_new((size_t)mutex,in_RAX,0x18a877);
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  return __mutex;
}

Assistant:

static PlatformSpecificMutex PThreadMutexCreate(void)
{
#ifdef CPPUTEST_HAVE_PTHREAD_MUTEX_LOCK
    pthread_mutex_t *mutex = new pthread_mutex_t;

    pthread_mutex_init(mutex, NULLPTR);
    return (PlatformSpecificMutex)mutex;
#else
    return NULLPTR;
#endif

}